

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Plan::NodeFinished(Plan *this,Node *node,string *err)

{
  pointer ppEVar1;
  bool bVar2;
  iterator want_e;
  pointer __k;
  
  if (node->dyndep_pending_ == true) {
    if (this->builder_ != (Builder *)0x0) {
      bVar2 = Builder::LoadDyndeps(this->builder_,node,err);
      return bVar2;
    }
    __assert_fail("builder_ && \"dyndep requires Plan to have a Builder\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                  ,0x1bb,"bool Plan::NodeFinished(Node *, string *)");
  }
  for (__k = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      ppEVar1 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish, __k != ppEVar1; __k = __k + 1) {
    want_e = std::
             _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
             ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                     *)this,__k);
    if ((_Rb_tree_header *)want_e._M_node != &(this->want_)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = EdgeMaybeReady(this,(iterator)want_e._M_node,err);
      if (!bVar2) break;
    }
  }
  return __k == ppEVar1;
}

Assistant:

bool Plan::NodeFinished(Node* node, string* err) {
  // If this node provides dyndep info, load it now.
  if (node->dyndep_pending()) {
    assert(builder_ && "dyndep requires Plan to have a Builder");
    // Load the now-clean dyndep file.  This will also update the
    // build plan and schedule any new work that is ready.
    return builder_->LoadDyndeps(node, err);
  }

  // See if we we want any edges from this node.
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end())
      continue;

    // See if the edge is now ready.
    if (!EdgeMaybeReady(want_e, err))
      return false;
  }
  return true;
}